

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

CreateSignatureHashRequestStruct * __thiscall
cfd::js::api::json::CreateSignatureHashRequest::ConvertToStruct
          (CreateSignatureHashRequestStruct *__return_storage_ptr__,CreateSignatureHashRequest *this
          )

{
  _Rb_tree_header *p_Var1;
  undefined1 local_140 [40];
  _Alloc_hider local_118;
  char local_108 [16];
  _Alloc_hider local_f8;
  char local_e8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  int64_t local_a8;
  _Alloc_hider local_a0;
  char local_90 [16];
  _Alloc_hider local_80;
  char local_70 [16];
  bool local_60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  (__return_storage_ptr__->tx)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->tx).field_2;
  (__return_storage_ptr__->tx)._M_string_length = 0;
  (__return_storage_ptr__->tx).field_2._M_local_buf[0] = '\0';
  CreateSignatureHashTxInRequestStruct::CreateSignatureHashTxInRequestStruct
            (&__return_storage_ptr__->txin);
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  CreateSignatureHashTxInRequest::ConvertToStruct
            ((CreateSignatureHashTxInRequestStruct *)local_140,&this->txin_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->txin,(string *)local_140);
  (__return_storage_ptr__->txin).vout = local_140._32_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->txin).key_data,(string *)&local_118);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->txin).key_data.type,(string *)&local_f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->txin).key_data.ignore_items._M_t);
  if (local_d8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_d8._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->txin).key_data.ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_d8._M_impl.super__Rb_tree_header._M_header._M_color;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->txin).key_data.ignore_items._M_t._M_impl.super__Rb_tree_header
             ._M_header + 8) = local_d8._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->txin).key_data.ignore_items._M_t._M_impl.super__Rb_tree_header
             ._M_header + 0x10) = local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->txin).key_data.ignore_items._M_t._M_impl.super__Rb_tree_header
             ._M_header + 0x18) = local_d8._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_d8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->txin).key_data.ignore_items._M_t._M_impl.super__Rb_tree_header.
          _M_header;
    (__return_storage_ptr__->txin).key_data.ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_d8._M_impl.super__Rb_tree_header._M_node_count;
    local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  (__return_storage_ptr__->txin).amount = local_a8;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->txin).hash_type,(string *)&local_a0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->txin).sighash_type,(string *)&local_80);
  (__return_storage_ptr__->txin).sighash_anyone_can_pay = local_60;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->txin).ignore_items._M_t);
  if (local_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_58._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_58._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_58._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_58._M_impl.super__Rb_tree_header._M_node_count;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_58);
  if (local_80._M_p != local_70) {
    operator_delete(local_80._M_p);
  }
  if (local_a0._M_p != local_90) {
    operator_delete(local_a0._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_d8);
  if (local_f8._M_p != local_e8) {
    operator_delete(local_f8._M_p);
  }
  if (local_118._M_p != local_108) {
    operator_delete(local_118._M_p);
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

CreateSignatureHashRequestStruct CreateSignatureHashRequest::ConvertToStruct() const {  // NOLINT
  CreateSignatureHashRequestStruct result;
  result.tx = tx_;
  result.txin = txin_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}